

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_bfins_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 arg1;
  byte bVar1;
  uint16_t uVar2;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 ret_02;
  uint arg2;
  uintptr_t o;
  uint uVar3;
  uintptr_t o_1;
  uint uVar4;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar2 = read_im16(env,s);
  uVar4 = (uint)uVar2;
  ret = tcg_ctx->cpu_dregs[insn & 7];
  arg1 = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + (ulong)(uVar2 >> 9 & 0x38));
  uVar3 = uVar4 - 1 & 0x1f;
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  if ((uVar2 & 0x20) == 0) {
    tcg_gen_shli_i32_m68k(tcg_ctx,QREG_CC_N,arg1,uVar3 ^ 0x1f);
  }
  else {
    tcg_gen_neg_i32(tcg_ctx,ret_00,tcg_ctx->cpu_dregs[uVar4 & 7]);
    tcg_gen_andi_i32_m68k(tcg_ctx,ret_00,ret_00,0x1f);
    tcg_gen_shl_i32(tcg_ctx,QREG_CC_N,arg1,ret_00);
  }
  arg2 = uVar2 >> 6 & 0x1f;
  set_cc_op(s,CC_OP_LOGIC);
  if ((uVar2 & 0x820) == 0) {
    uVar4 = arg2 + uVar3 + 1;
    if (uVar4 < 0x21) {
      tcg_gen_deposit_i32_m68k(tcg_ctx,ret,ret,arg1,0x20 - uVar4,uVar3 + 1);
    }
    else {
      uVar3 = -2 << (sbyte)uVar3;
      tcg_gen_andi_i32_m68k(tcg_ctx,ret_00,arg1,~uVar3);
      tcg_gen_rotri_i32_m68k(tcg_ctx,ret_00,ret_00,uVar4 & 0x1f);
      bVar1 = (byte)uVar4 & 0x1f;
      tcg_gen_andi_i32_m68k(tcg_ctx,ret,ret,uVar3 >> bVar1 | uVar3 << 0x20 - bVar1);
      tcg_gen_or_i32(tcg_ctx,ret,ret,ret_00);
    }
  }
  else {
    ret_01 = tcg_temp_new_i32(tcg_ctx);
    ret_02 = tcg_temp_new_i32(tcg_ctx);
    if ((uVar2 & 0x20) == 0) {
      uVar4 = -2 << (sbyte)uVar3;
      tcg_gen_andi_i32_m68k(tcg_ctx,ret_00,arg1,~uVar4);
      tcg_gen_movi_i32(tcg_ctx,ret_01,uVar4);
      tcg_gen_movi_i32(tcg_ctx,ret_02,uVar3 + 1 & 0x1f);
    }
    else {
      tcg_gen_subi_i32_m68k(tcg_ctx,ret_02,tcg_ctx->cpu_dregs[uVar4 & 7],1);
      tcg_gen_andi_i32_m68k(tcg_ctx,ret_02,ret_02,0x1f);
      tcg_gen_movi_i32(tcg_ctx,ret_01,-2);
      tcg_gen_shl_i32(tcg_ctx,ret_01,ret_01,ret_02);
      tcg_gen_mov_i32(tcg_ctx,ret_02,tcg_ctx->cpu_dregs[uVar4 & 7]);
      tcg_gen_andc_i32_m68k(tcg_ctx,ret_00,arg1,ret_01);
    }
    if ((uVar2 >> 0xb & 1) == 0) {
      tcg_gen_addi_i32_m68k(tcg_ctx,ret_02,ret_02,arg2);
    }
    else {
      tcg_gen_add_i32(tcg_ctx,ret_02,ret_02,tcg_ctx->cpu_dregs[uVar2 >> 6 & 7]);
    }
    tcg_gen_andi_i32_m68k(tcg_ctx,ret_02,ret_02,0x1f);
    tcg_gen_rotr_i32_m68k(tcg_ctx,ret_01,ret_01,ret_02);
    tcg_gen_rotr_i32_m68k(tcg_ctx,ret_00,ret_00,ret_02);
    tcg_gen_and_i32(tcg_ctx,ret,ret,ret_01);
    tcg_gen_or_i32(tcg_ctx,ret,ret,ret_00);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_02 + (long)tcg_ctx));
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  }
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

DISAS_INSN(bfins_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    TCGv dst = DREG(insn, 0);
    TCGv src = DREG(ext, 12);
    int len = ((extract32(ext, 0, 5) - 1) & 31) + 1;
    int ofs = extract32(ext, 6, 5);  /* big bit-endian */
    int pos = 32 - ofs - len;        /* little bit-endian */
    TCGv tmp;

    tmp = tcg_temp_new(tcg_ctx);

    if (ext & 0x20) {
        /* Variable width */
        tcg_gen_neg_i32(tcg_ctx, tmp, DREG(ext, 0));
        tcg_gen_andi_i32(tcg_ctx, tmp, tmp, 31);
        tcg_gen_shl_i32(tcg_ctx, QREG_CC_N, src, tmp);
    } else {
        /* Immediate width */
        tcg_gen_shli_i32(tcg_ctx, QREG_CC_N, src, 32 - len);
    }
    set_cc_op(s, CC_OP_LOGIC);

    /* Immediate width and offset */
    if ((ext & 0x820) == 0) {
        /* Check for suitability for deposit.  */
        if (pos >= 0) {
            tcg_gen_deposit_i32(tcg_ctx, dst, dst, src, pos, len);
        } else {
#ifdef _MSC_VER
            uint32_t maski = 0xfffffffeU << (len - 1);
#else
            uint32_t maski = -2U << (len - 1);
#endif
            uint32_t roti = (ofs + len) & 31;
            tcg_gen_andi_i32(tcg_ctx, tmp, src, ~maski);
            tcg_gen_rotri_i32(tcg_ctx, tmp, tmp, roti);
            tcg_gen_andi_i32(tcg_ctx, dst, dst, ror32(maski, roti));
            tcg_gen_or_i32(tcg_ctx, dst, dst, tmp);
        }
    } else {
        TCGv mask = tcg_temp_new(tcg_ctx);
        TCGv rot = tcg_temp_new(tcg_ctx);

        if (ext & 0x20) {
            /* Variable width */
            tcg_gen_subi_i32(tcg_ctx, rot, DREG(ext, 0), 1);
            tcg_gen_andi_i32(tcg_ctx, rot, rot, 31);
            tcg_gen_movi_i32(tcg_ctx, mask, -2);
            tcg_gen_shl_i32(tcg_ctx, mask, mask, rot);
            tcg_gen_mov_i32(tcg_ctx, rot, DREG(ext, 0));
            tcg_gen_andc_i32(tcg_ctx, tmp, src, mask);
        } else {
            /* Immediate width (variable offset) */
#ifdef _MSC_VER
            uint32_t maski = 0xfffffffeU << (len - 1);
#else
            uint32_t maski = -2U << (len - 1);
#endif
            tcg_gen_andi_i32(tcg_ctx, tmp, src, ~maski);
            tcg_gen_movi_i32(tcg_ctx, mask, maski);
            tcg_gen_movi_i32(tcg_ctx, rot, len & 31);
        }
        if (ext & 0x800) {
            /* Variable offset */
            tcg_gen_add_i32(tcg_ctx, rot, rot, DREG(ext, 6));
        } else {
            /* Immediate offset (variable width) */
            tcg_gen_addi_i32(tcg_ctx, rot, rot, ofs);
        }
        tcg_gen_andi_i32(tcg_ctx, rot, rot, 31);
        tcg_gen_rotr_i32(tcg_ctx, mask, mask, rot);
        tcg_gen_rotr_i32(tcg_ctx, tmp, tmp, rot);
        tcg_gen_and_i32(tcg_ctx, dst, dst, mask);
        tcg_gen_or_i32(tcg_ctx, dst, dst, tmp);

        tcg_temp_free(tcg_ctx, rot);
        tcg_temp_free(tcg_ctx, mask);
    }
    tcg_temp_free(tcg_ctx, tmp);
}